

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O2

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  int *pDelays;
  uint uVar1;
  uint uWord;
  char cVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Lpk_Res_t *pLVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  char cVar15;
  char *__assertion;
  uint uVar16;
  long lVar17;
  
  Lpk_MuxAnalize::Res.nSuppSizeS = 0;
  Lpk_MuxAnalize::Res.nSuppSizeL = 0;
  Lpk_MuxAnalize::Res.DelayEst = 0;
  Lpk_MuxAnalize::Res.AreaEst = 0;
  Lpk_MuxAnalize::Res.nBSVars = 0;
  Lpk_MuxAnalize::Res.BSVars = 0;
  Lpk_MuxAnalize::Res.nCofVars = 0;
  Lpk_MuxAnalize::Res.pCofVars[0] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[1] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[2] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[3] = '\0';
  Lpk_MuxAnalize::Res.Variable = 0;
  Lpk_MuxAnalize::Res.Polarity = 0;
  if ((-1 << ((byte)(*(uint *)&p->field_0x8 >> 7) & 0x1f) ^ p->uSupp) == 0xffffffff) {
    if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
      __assertion = "p->fSupports";
      uVar16 = 0x34;
    }
    else {
      Lpk_MuxAnalize::Res.Variable = -1;
      Lpk_MuxAnalize::Res.Polarity = 0;
      pDelays = p->pDelays;
      lVar17 = 0;
      while( true ) {
        if (lVar17 == 0x10) {
          pLVar11 = (Lpk_Res_t *)0x0;
          if (Lpk_MuxAnalize::Res.Variable != -1) {
            pLVar11 = &Lpk_MuxAnalize::Res;
          }
          return pLVar11;
        }
        uVar16 = 1 << ((byte)lVar17 & 0x1f);
        if ((p->uSupp >> ((uint)lVar17 & 0x1f) & 1) == 0) goto LAB_00412ed9;
        uVar1 = p->puSupps[lVar17 * 2];
        uVar5 = Kit_WordCountOnes(uVar1);
        uWord = p->puSupps[lVar17 * 2 + 1];
        uVar6 = Kit_WordCountOnes(uWord);
        uVar14 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
        if (uVar14 <= uVar5) break;
        if (uVar14 <= uVar6) {
          __assertion = "nSuppSize1 < (int)p->nVars";
          uVar16 = 0x3c;
          goto LAB_00412f71;
        }
        if ((uVar5 != 0) && (uVar6 != 0)) {
          uVar14 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
          iVar7 = uVar14 - 2;
          if ((iVar7 < (int)uVar5) || (iVar7 < (int)uVar6)) {
            cVar12 = (char)uVar6;
            if (iVar7 < (int)uVar5) {
              cVar4 = (char)uVar5;
              if (iVar7 < (int)uVar6) {
                if (uVar14 < uVar5) {
                  iVar10 = Lpk_SuppDelay(uVar1 | uVar16,pDelays);
                  iVar8 = Lpk_SuppDelay(p->puSupps[lVar17 * 2 + 1],pDelays);
                  iVar7 = iVar8 + 1;
                  if (iVar8 + 1 < iVar10) {
                    iVar7 = iVar10;
                  }
                  if (uVar6 <= uVar14) {
                    bVar13 = (byte)(*(uint *)&p->field_0x8 >> 0xc);
                    cVar4 = cVar4 + '\x01';
                    goto LAB_00412d80;
                  }
                  iVar10 = Lpk_SuppDelay(uVar16 | p->puSupps[lVar17 * 2 + 1],pDelays);
                  iVar9 = Lpk_SuppDelay(p->puSupps[lVar17 * 2],pDelays);
                  iVar8 = iVar9 + 1;
                  if (iVar9 + 1 < iVar10) {
                    iVar8 = iVar10;
                  }
                  cVar15 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
                  iVar9 = iVar8;
                  if (iVar7 < iVar8) {
                    iVar9 = iVar7;
                  }
                  cVar2 = cVar12;
                  if (iVar8 < iVar7) {
                    cVar2 = cVar4;
                    cVar4 = cVar12;
                  }
                  iVar10 = (((int)((char)(cVar4 + '\x01') / cVar15) -
                            (uint)((char)(cVar4 + '\x01') % cVar15 == '\0')) +
                            (int)((char)(cVar2 + -1) / cVar15) + 2) -
                           (uint)((char)(cVar2 + -1) % cVar15 == '\0');
                  bVar3 = iVar8 <= iVar7;
                  iVar7 = iVar9;
                }
                else {
                  iVar10 = Lpk_SuppDelay(uWord | uVar16,pDelays);
                  iVar8 = Lpk_SuppDelay(p->puSupps[lVar17 * 2],pDelays);
                  iVar7 = iVar8 + 1;
                  if (iVar8 + 1 < iVar10) {
                    iVar7 = iVar10;
                  }
                  cVar4 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
                  iVar10 = ((int)((char)(cVar12 + '\x01') / cVar4) -
                           (uint)((char)(cVar12 + '\x01') % cVar4 == '\0')) + 2;
                  bVar3 = true;
                }
              }
              else {
                iVar10 = Lpk_SuppDelay(uWord | uVar16,pDelays);
                iVar8 = Lpk_SuppDelay(p->puSupps[lVar17 * 2],pDelays);
                iVar7 = iVar8 + 1;
                if (iVar8 + 1 < iVar10) {
                  iVar7 = iVar10;
                }
                cVar12 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
                iVar10 = ((int)((char)(cVar4 + -1) / cVar12) -
                         (uint)((char)(cVar4 + -1) % cVar12 == '\0')) + 2;
                bVar3 = true;
              }
            }
            else {
              iVar10 = Lpk_SuppDelay(uVar1 | uVar16,pDelays);
              iVar8 = Lpk_SuppDelay(p->puSupps[lVar17 * 2 + 1],pDelays);
              iVar7 = iVar8 + 1;
              if (iVar8 + 1 < iVar10) {
                iVar7 = iVar10;
              }
              bVar13 = (byte)(*(uint *)&p->field_0x8 >> 0xc);
              cVar4 = cVar12 + -1;
LAB_00412d80:
              cVar12 = (bVar13 & 0xf) - 1;
              iVar10 = ((int)(cVar4 / cVar12) - (uint)(cVar4 % cVar12 == '\0')) + 2;
              bVar3 = false;
            }
          }
          else {
            iVar7 = Lpk_SuppDelay(uVar1 | uVar16,pDelays);
            iVar8 = Lpk_SuppDelay(p->puSupps[lVar17 * 2 + 1],pDelays);
            iVar10 = iVar8 + 1;
            if (iVar8 + 1 < iVar7) {
              iVar10 = iVar7;
            }
            iVar7 = Lpk_SuppDelay(uVar16 | p->puSupps[lVar17 * 2 + 1],pDelays);
            iVar9 = Lpk_SuppDelay(p->puSupps[lVar17 * 2],pDelays);
            iVar8 = iVar9 + 1;
            if (iVar9 + 1 < iVar7) {
              iVar8 = iVar7;
            }
            iVar7 = iVar8;
            if (iVar10 < iVar8) {
              iVar7 = iVar10;
            }
            bVar3 = iVar8 <= iVar10;
            iVar10 = 2;
          }
          if ((iVar7 <= (int)p->nDelayLim) &&
             (iVar10 <= (int)(*(uint *)&p->field_0x8 >> 0x10 & 0x3fff))) {
            uVar5 = uVar5 + (uint)(bVar3 ^ 1) * 2;
            uVar6 = uVar6 + (uint)bVar3 * 2;
            uVar16 = uVar6;
            if (uVar5 < uVar6) {
              uVar16 = uVar5;
            }
            uVar1 = uVar6;
            if (uVar6 < uVar5) {
              uVar1 = uVar5;
            }
            if (uVar1 <= (*(uint *)&p->field_0x8 >> 7 & 0x1f)) {
              if (Lpk_MuxAnalize::Res.Variable != -1) {
                if (Lpk_MuxAnalize::Res.AreaEst <= iVar10) {
                  if (Lpk_MuxAnalize::Res.AreaEst == iVar10) {
                    if (((int)(uVar5 + uVar6) <
                         Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS) ||
                       ((Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS ==
                         uVar5 + uVar6 && (iVar7 < Lpk_MuxAnalize::Res.DelayEst))))
                    goto LAB_00412eb3;
                  }
                  goto LAB_00412ed9;
                }
              }
LAB_00412eb3:
              Lpk_MuxAnalize::Res.Polarity._0_1_ = bVar3;
              Lpk_MuxAnalize::Res.Variable = (uint)lVar17;
              Lpk_MuxAnalize::Res.Polarity._1_3_ = 0;
              Lpk_MuxAnalize::Res.AreaEst = iVar10;
              Lpk_MuxAnalize::Res.DelayEst = iVar7;
              Lpk_MuxAnalize::Res.nSuppSizeL = uVar1;
              Lpk_MuxAnalize::Res.nSuppSizeS = uVar16;
            }
          }
        }
LAB_00412ed9:
        lVar17 = lVar17 + 1;
      }
      __assertion = "nSuppSize0 < (int)p->nVars";
      uVar16 = 0x3b;
    }
  }
  else {
    __assertion = "p->uSupp == Kit_BitMask(p->nVars)";
    uVar16 = 0x33;
  }
LAB_00412f71:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                ,uVar16,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}